

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
SmallArray<ArgumentData,_3U>::SmallArray(SmallArray<ArgumentData,_3U> *this,Allocator *allocator)

{
  ArgumentData *local_20;
  Allocator *allocator_local;
  SmallArray<ArgumentData,_3U> *this_local;
  
  local_20 = this->little;
  do {
    ArgumentData::ArgumentData(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != (ArgumentData *)&this->allocator);
  this->allocator = allocator;
  this->data = this->little;
  this->max = 3;
  this->count = 0;
  return;
}

Assistant:

SmallArray(Allocator *allocator = 0): allocator(allocator)
	{
		data = little;
		max = N;

		count = 0;
	}